

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

void __thiscall
spirv_cross::SPIRFunction::SPIRFunction
          (SPIRFunction *this,TypeID return_type_,TypeID function_type_)

{
  (this->super_IVariant).self.id = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRFunction_004908f0;
  *(uint32_t *)&(this->super_IVariant).field_0xc = return_type_.id;
  (this->function_type).id = function_type_.id;
  (this->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size = 0;
  (this->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr =
       (Parameter *)&(this->arguments).stack_storage;
  (this->arguments).buffer_capacity = 8;
  (this->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size = 0;
  (this->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr =
       (Parameter *)&(this->shadow_arguments).stack_storage;
  (this->shadow_arguments).buffer_capacity = 8;
  (this->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size
       = 0;
  (this->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
       (TypedID<(spirv_cross::Types)2> *)&(this->local_variables).stack_storage;
  (this->local_variables).buffer_capacity = 8;
  (this->entry_block).id = 0;
  (this->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.buffer_size = 0;
  (this->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr =
       (TypedID<(spirv_cross::Types)6> *)&(this->blocks).stack_storage;
  (this->blocks).buffer_capacity = 8;
  (this->combined_parameters).
  super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size = 0;
  (this->combined_parameters).
  super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr =
       (CombinedImageSamplerParameter *)&(this->combined_parameters).stack_storage;
  (this->combined_parameters).buffer_capacity = 8;
  (this->fixup_hooks_in).buffer_capacity = 0;
  (this->fixup_hooks_in).super_VectorView<std::function<void_()>_>.ptr = (function<void_()> *)0x0;
  (this->fixup_hooks_in).super_VectorView<std::function<void_()>_>.buffer_size = 0;
  (this->constant_arrays_needed_on_stack).
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = 0;
  (this->fixup_hooks_out).super_VectorView<std::function<void_()>_>.buffer_size = 0;
  (this->fixup_hooks_out).buffer_capacity = 0;
  (this->entry_line).file_id = 0;
  (this->entry_line).line_literal = 0;
  (this->fixup_hooks_out).super_VectorView<std::function<void_()>_>.ptr = (function<void_()> *)0x0;
  (this->constant_arrays_needed_on_stack).
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
       (TypedID<(spirv_cross::Types)0> *)&(this->constant_arrays_needed_on_stack).stack_storage;
  (this->constant_arrays_needed_on_stack).buffer_capacity = 8;
  this->active = false;
  this->flush_undeclared = true;
  this->do_combined_parameters = true;
  return;
}

Assistant:

SPIRFunction(TypeID return_type_, TypeID function_type_)
	    : return_type(return_type_)
	    , function_type(function_type_)
	{
	}